

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void google::protobuf::Field::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 3));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[3]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 4));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[4]._internal_metadata_);
    RepeatedPtrField<google::protobuf::Option>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::Option> *)&self[1]._internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/type.pb.cc"
             ,0x3c7,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void Field::SharedDtor(MessageLite& self) {
  Field& this_ = static_cast<Field&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.type_url_.Destroy();
  this_._impl_.json_name_.Destroy();
  this_._impl_.default_value_.Destroy();
  this_._impl_.~Impl_();
}